

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O2

bool leveldb::SomeFileOverlapsRange
               (InternalKeyComparator *icmp,bool disjoint_sorted_files,
               vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *files,
               Slice *smallest_user_key,Slice *largest_user_key)

{
  Comparator *ucmp;
  FileMetaData *f;
  pointer ppFVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  size_t i;
  ulong uVar6;
  undefined7 in_register_00000031;
  InternalKey small_key;
  Slice local_40;
  
  ucmp = icmp->user_comparator_;
  if ((int)CONCAT71(in_register_00000031,disjoint_sorted_files) == 0) {
    uVar6 = 0;
    while( true ) {
      ppFVar1 = (files->
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
      bVar3 = uVar6 < (ulong)((long)(files->
                                    super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar1 >> 3
                             );
      if (!bVar3) break;
      f = ppFVar1[uVar6];
      if (smallest_user_key == (Slice *)0x0) {
LAB_00114857:
        bVar2 = BeforeFile(ucmp,largest_user_key,f);
        if (!bVar2) {
          return bVar3;
        }
      }
      else {
        small_key.rep_._0_16_ = InternalKey::user_key(&f->largest);
        iVar5 = (*ucmp->_vptr_Comparator[2])(ucmp,smallest_user_key,&small_key);
        if (iVar5 < 1) goto LAB_00114857;
      }
      uVar6 = uVar6 + 1;
    }
  }
  else {
    if (smallest_user_key == (Slice *)0x0) {
      uVar6 = 0;
    }
    else {
      InternalKey::InternalKey(&small_key,smallest_user_key,0xffffffffffffff,kTypeValue);
      local_40 = InternalKey::Encode(&small_key);
      uVar4 = FindFile(icmp,files,&local_40);
      uVar6 = (ulong)uVar4;
      std::__cxx11::string::~string((string *)&small_key);
    }
    ppFVar1 = (files->
              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>)
              ._M_impl.super__Vector_impl_data._M_start;
    if (uVar6 < (ulong)((long)(files->
                              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar1 >> 3)) {
      bVar3 = BeforeFile(ucmp,largest_user_key,ppFVar1[uVar6]);
      bVar3 = !bVar3;
    }
    else {
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

bool SomeFileOverlapsRange(const InternalKeyComparator& icmp,
                           bool disjoint_sorted_files,
                           const std::vector<FileMetaData*>& files,
                           const Slice* smallest_user_key,
                           const Slice* largest_user_key) {
  const Comparator* ucmp = icmp.user_comparator();
  if (!disjoint_sorted_files) {
    // Need to check against all files
    for (size_t i = 0; i < files.size(); i++) {
      const FileMetaData* f = files[i];
      if (AfterFile(ucmp, smallest_user_key, f) ||
          BeforeFile(ucmp, largest_user_key, f)) {
        // No overlap
      } else {
        return true;  // Overlap
      }
    }
    return false;
  }

  // Binary search over file list
  uint32_t index = 0;
  if (smallest_user_key != nullptr) {
    // Find the earliest possible internal key for smallest_user_key
    InternalKey small_key(*smallest_user_key, kMaxSequenceNumber,
                          kValueTypeForSeek);
    index = FindFile(icmp, files, small_key.Encode());
  }

  if (index >= files.size()) {
    // beginning of range is after all files, so no overlap.
    return false;
  }

  return !BeforeFile(ucmp, largest_user_key, files[index]);
}